

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O1

aspa_status
aspa_table_update_in_place
          (aspa_table *aspa_table,rtr_socket *rtr_socket,aspa_update_operation *operations,
          size_t count,aspa_update_operation **failed_operation)

{
  aspa_store_node **ppaVar1;
  aspa_record *record;
  aspa_update_operation *paVar2;
  aspa_array *paVar3;
  size_t __nmemb;
  uint32_t *__base;
  aspa_status aVar4;
  aspa_store_node *paVar5;
  aspa_record *paVar6;
  aspa_store_node *paVar7;
  aspa_store_node **ppaVar8;
  ulong uVar9;
  aspa_update_operation *paVar10;
  ulong index;
  long in_FS_OFFSET;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  aspa_array *a;
  aspa_status local_74;
  aspa_array *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (aspa_table == (aspa_table *)0x0) {
    __assert_fail("aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x268,
                  "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x269,
                  "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  if (failed_operation == (aspa_update_operation **)0x0) {
    __assert_fail("failed_operation",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x26a,
                  "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  if (count == 0 || operations == (aspa_update_operation *)0x0) {
    local_74 = -(uint)(operations == (aspa_update_operation *)0x0 && count != 0);
    goto LAB_0010e855;
  }
  qsort(operations,count,0x30,compare_update_operations);
  pthread_rwlock_wrlock((pthread_rwlock_t *)aspa_table);
  ppaVar1 = &aspa_table->store;
  paVar7 = aspa_table->store;
  if (paVar7 == (aspa_store_node *)0x0) {
    ppaVar8 = (aspa_store_node **)0x0;
  }
  else {
    ppaVar8 = ppaVar1;
    if (paVar7->rtr_socket != rtr_socket) {
      ppaVar8 = (aspa_store_node **)0x0;
      do {
        paVar5 = paVar7;
        paVar7 = paVar5->next;
        if (paVar7 == (aspa_store_node *)0x0) goto LAB_0010e588;
      } while (paVar7->rtr_socket != rtr_socket);
      ppaVar8 = &paVar5->next;
    }
  }
LAB_0010e588:
  if ((ppaVar8 == (aspa_store_node **)0x0) || (*ppaVar8 == (aspa_store_node *)0x0)) {
    local_40 = (aspa_array *)0x0;
    aVar4 = aspa_array_create(&local_40);
    paVar3 = local_40;
    if (aVar4 == ASPA_SUCCESS) {
      paVar7 = (aspa_store_node *)lrtr_malloc(0x18);
      if (paVar7 != (aspa_store_node *)0x0) {
        paVar7->rtr_socket = rtr_socket;
        paVar7->aspa_array = paVar3;
        paVar7->next = *ppaVar1;
        *ppaVar1 = paVar7;
        if ((ppaVar1 != (aspa_store_node **)0x0) &&
           (ppaVar8 = ppaVar1, *ppaVar1 != (aspa_store_node *)0x0)) goto LAB_0010e59b;
      }
      aspa_array_free(local_40,false);
      pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    }
    local_74 = ASPA_ERROR;
  }
  else {
LAB_0010e59b:
    if (*ppaVar8 == (aspa_store_node *)0x0) {
      __assert_fail("*node",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                    ,0x28a,
                    "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                   );
    }
    paVar3 = (*ppaVar8)->aspa_array;
    if (paVar3 == (aspa_array *)0x0) {
      __assert_fail("(*node)->aspa_array",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                    ,0x28b,
                    "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                   );
    }
    aspa_array_reserve(paVar3,paVar3->size + count);
    bVar11 = count != 0;
    if (count == 0) {
      local_74 = ASPA_ERROR;
    }
    else {
      local_74 = ASPA_ERROR;
      index = 0;
      uVar9 = 0;
      do {
        paVar2 = operations + uVar9;
        paVar10 = (aspa_update_operation *)0x0;
        if (uVar9 < count - 1) {
          paVar10 = operations + uVar9 + 1;
        }
        if ((operations + uVar9 + 1)[-1].type == ASPA_REMOVE) {
          if ((paVar2->record).provider_count != 0) {
            __assert_fail("current->record.provider_count == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                          ,0x29a,
                          "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                         );
          }
          if ((paVar2->record).provider_asns != (uint32_t *)0x0) {
            __assert_fail("!current->record.provider_asns",
                          "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                          ,0x29b,
                          "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                         );
          }
        }
        __nmemb = (paVar2->record).provider_count;
        if ((__nmemb != 0) && (__base = (paVar2->record).provider_asns, __base != (uint32_t *)0x0))
        {
          qsort(__base,__nmemb,4,compare_asns);
        }
        record = &paVar2->record;
        while ((index < paVar3->size &&
               (paVar6 = aspa_array_get_record(paVar3,index),
               paVar6->customer_asn < record->customer_asn))) {
          index = index + 1;
        }
        paVar6 = aspa_array_get_record(paVar3,index);
        if (paVar6 == (aspa_record *)0x0) {
          bVar12 = false;
        }
        else {
          bVar12 = paVar6->customer_asn == record->customer_asn;
        }
        if (uVar9 < count - 1) {
          bVar13 = (paVar10->record).customer_asn == record->customer_asn;
        }
        else {
          bVar13 = false;
        }
        if (paVar2->type == ASPA_REMOVE) {
          if (bVar12) {
            (paVar2->record).provider_count = paVar6->provider_count;
            (paVar2->record).provider_asns = paVar6->provider_asns;
            aVar4 = aspa_array_remove(paVar3,index,false);
            if (aVar4 == ASPA_SUCCESS) goto LAB_0010e767;
          }
          *failed_operation = paVar2;
          pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
          local_74 = ASPA_RECORD_NOT_FOUND;
LAB_0010e760:
          bVar12 = true;
        }
        else {
          if (paVar2->type == ASPA_ADD) {
            if (bVar12) {
              *failed_operation = paVar2;
              pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
              local_74 = ASPA_DUPLICATE_RECORD;
            }
            else {
              if ((bVar13) && (paVar10->type == ASPA_REMOVE)) {
                uVar9 = uVar9 + 1;
                paVar2->is_no_op = true;
                paVar10->is_no_op = true;
                bVar12 = false;
                goto LAB_0010e780;
              }
              aVar4 = aspa_array_insert(paVar3,index,record,true);
              if (aVar4 == ASPA_SUCCESS) goto LAB_0010e767;
              *failed_operation = paVar2;
              pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
              local_74 = ASPA_ERROR;
            }
            goto LAB_0010e760;
          }
LAB_0010e767:
          aspa_table_notify_clients(aspa_table,record,rtr_socket,paVar2->type);
          bVar12 = false;
        }
LAB_0010e780:
        if (bVar12) break;
        uVar9 = uVar9 + 1;
        bVar11 = uVar9 < count;
      } while (bVar11);
    }
    if (!bVar11) {
      pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
      local_74 = ASPA_SUCCESS;
    }
  }
LAB_0010e855:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_74;
  }
  __stack_chk_fail();
}

Assistant:

enum aspa_status aspa_table_update_in_place(struct aspa_table *aspa_table, struct rtr_socket *rtr_socket,
					    struct aspa_update_operation *operations, size_t count,
					    struct aspa_update_operation **failed_operation)
{
	// Fail hard in debug builds.
	assert(aspa_table);
	assert(rtr_socket);
	assert(failed_operation);

	if (!aspa_table || !rtr_socket || !failed_operation || ((count > 0) && !operations))
		return ASPA_ERROR;

	if (count == 0)
		return ASPA_SUCCESS;

	// stable sort operations, so operations dealing with the same customer ASN
	// are located right next to each other
	qsort(operations, count, sizeof(struct aspa_update_operation), compare_update_operations);

	pthread_rwlock_wrlock(&aspa_table->lock);
	struct aspa_store_node **node = aspa_store_get_node(&aspa_table->store, rtr_socket);

	if (!node || !*node) {
		// The given table doesn't have a node for that socket, so create one
		struct aspa_array *a = NULL;

		if (aspa_array_create(&a) != ASPA_SUCCESS)
			return ASPA_ERROR;

		// Insert into table
		if (aspa_store_create_node(&aspa_table->store, rtr_socket, a, &node) != ASPA_SUCCESS || !node ||
		    !*node) {
			aspa_array_free(a, false);
			pthread_rwlock_unlock(&aspa_table->lock);
			return ASPA_ERROR;
		}
	}

	assert(node);
	assert(*node);
	assert((*node)->aspa_array);

	struct aspa_array *array = (*node)->aspa_array;
	size_t existing_i = 0;

	// preemptively allocating enough space
	aspa_array_reserve(array, count + array->size);

	for (size_t i = 0; i < count; i++) {
		struct aspa_update_operation *current = &operations[i];
		struct aspa_update_operation *next = (i < count - 1) ? &(operations[i + 1]) : NULL;

#ifndef NDEBUG
		// Sanity check record
		if (current->type == ASPA_REMOVE) {
			assert(current->record.provider_count == 0);
			assert(!current->record.provider_asns);
		}
#endif

		// Sort providers.
		// We consider this an implementation detail, callers must not make any assumptions on the
		// ordering of provider ASNs.
		if (current->record.provider_count > 0 && current->record.provider_asns)
			qsort(current->record.provider_asns, current->record.provider_count, sizeof(uint32_t),
			      compare_asns);

		while (existing_i < array->size &&
		       aspa_array_get_record(array, existing_i)->customer_asn < current->record.customer_asn) {
			existing_i += 1;
		}

		struct aspa_record *existing_record = aspa_array_get_record(array, existing_i);

		// existing record and current op have matching CAS
		bool existing_matches_current = existing_record &&
						existing_record->customer_asn == current->record.customer_asn;

		// next record and current op have matching CAS
		bool next_matches_current = next && next->record.customer_asn == current->record.customer_asn;

		// MARK: Handling 'add' operations
		if (current->type == ASPA_ADD) {
			// Attempt to add record with $CAS, but record with $CAS already exists
			// Error: Duplicate Add.
			if (existing_matches_current) {
				*failed_operation = current;
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_DUPLICATE_RECORD;
			}

			// This operation adds a record with $CAS, the next op however removes this $CAS record again.
			if (next_matches_current && next->type == ASPA_REMOVE) {
#if ASPA_NOTIFY_NO_OPS
				// Complete record's providers for clients
				next->record = current->record;
				aspa_table_notify_clients(aspa_table, &current->record, rtr_socket, current->type);
				aspa_table_notify_clients(aspa_table, &next->record, rtr_socket, next->type);
#endif

				// Mark as no-op.
				current->is_no_op = true;
				next->is_no_op = true;

				// Skip next
				i += 1;
				continue;
			}

			// Add record by appending it to new array (copy providers)
			if (aspa_array_insert(array, existing_i, &current->record, true) != ASPA_SUCCESS) {
				*failed_operation = current;
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_ERROR;
			}
		}

		// MARK: Handling 'remove' operations
		else if (current->type == ASPA_REMOVE) {
			// Attempt to remove record with $CAS, but record with $CAS does not exist
			// Error: Removal of unknown record.
			if (!existing_matches_current) {
				*failed_operation = current;
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_RECORD_NOT_FOUND;
			}

			// If it's a remove operation, we insert a reference to the removed record's providers.
			current->record.provider_count = existing_record->provider_count;
			current->record.provider_asns = existing_record->provider_asns;

			// Remove record (don't release providers)
			if (aspa_array_remove(array, existing_i, false) != ASPA_SUCCESS) {
				*failed_operation = current;
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_RECORD_NOT_FOUND;
			}
		}

		// Notify clients
		aspa_table_notify_clients(aspa_table, &current->record, rtr_socket, current->type);
	}

	pthread_rwlock_unlock(&aspa_table->lock);
	return ASPA_SUCCESS;
}